

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_fix.cpp
# Opt level: O1

void Omega_h::fix(Mesh *mesh,AdaptOpts *adapt_opts,Omega_h_Isotropy isotropy,bool verbose)

{
  uint uVar1;
  bool verbose_00;
  undefined7 in_register_00000009;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  
  if ((int)CONCAT71(in_register_00000009,verbose) == 0) {
    verbose_00 = false;
  }
  else {
    verbose_00 = can_print(mesh);
  }
  if (verbose_00 != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Computing bad-mesh \"implied\" metric\n",0x24);
  }
  uVar1 = mesh->dim_;
  if (uVar1 < 4) {
    if (uVar1 == 1) {
      compute_ill_metric_dim<1>(mesh,adapt_opts,isotropy);
    }
    else if (uVar1 == 2) {
      compute_ill_metric_dim<2>(mesh,adapt_opts,isotropy);
    }
    else {
      if (uVar1 != 3) {
        pcVar4 = "false";
        pcVar3 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_fix.cpp"
        ;
        uVar2 = 0x4f;
        goto LAB_002c5cb5;
      }
      compute_ill_metric_dim<3>(mesh,adapt_opts,isotropy);
    }
    fix_for_given_metric(mesh,adapt_opts,verbose_00);
    return;
  }
  pcVar4 = "0 <= dim_ && dim_ <= 3";
  pcVar3 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp";
  uVar2 = 0x33;
LAB_002c5cb5:
  fail("assertion %s failed at %s +%d\n",pcVar4,pcVar3,uVar2);
}

Assistant:

void fix(Mesh* mesh, AdaptOpts const& adapt_opts, Omega_h_Isotropy isotropy,
    bool verbose) {
  verbose = verbose && can_print(mesh);
  if (verbose) std::cout << "Computing bad-mesh \"implied\" metric\n";
  compute_ill_metric(mesh, adapt_opts, isotropy);
  fix_for_given_metric(mesh, adapt_opts, verbose);
  // TODO: commenting this out because metric quality corrections assume
  // isotropy!!! we need to fix this, but for now just skip this step
  if ((0)) {
    if (verbose) std::cout << "Computing more typical \"implied\" metric\n";
    compute_typical_metric(mesh, isotropy);
    fix_for_given_metric(mesh, adapt_opts, verbose);
  }
}